

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool getn(char *prompt,int *num,int def)

{
  int iVar1;
  char *pcVar2;
  char local_a8 [4];
  int res;
  char str [127];
  int def_local;
  int *num_local;
  char *prompt_local;
  
  unique0x100000c6 = def;
  while( true ) {
    printf("%s",prompt);
    fflush(_stdout);
    pcVar2 = fgets(local_a8,0x7f,_stdin);
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    if (local_a8[0] == '\n') {
      *num = stack0xffffffffffffffdc;
      return true;
    }
    iVar1 = __isoc99_sscanf(local_a8,"%d",num);
    if (iVar1 == 1) {
      return true;
    }
    if (iVar1 == -1) break;
    printf("Not a valid number!\n");
  }
  printf("\n");
  return false;
}

Assistant:

bool getn(const char* prompt, int* num, const int def) {
  char str[127]; // Probably overkill
  while (true) {
    printf("%s", prompt);
    fflush(stdout);
    if (!fgets(str, sizeof str, stdin)) return false;
    if (*str == '\n') { // Nothing was entered
      *num = def;
      break;
    } else {
      const int res = sscanf(str, "%d", num);
      if (res == 1) break;
      else if (res == EOF) {
        printf("\n");
        return false;
      } else {
        printf("Not a valid number!\n");
      }
    }
  }

  return true;
}